

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O2

CVmSrcfEntry * __thiscall CVmSrcfTable::add_entry(CVmSrcfTable *this,int orig_index,size_t name_len)

{
  size_t __size;
  ulong uVar1;
  CVmSrcfEntry *this_00;
  CVmSrcfEntry **__ptr;
  ulong uVar2;
  
  this_00 = (CVmSrcfEntry *)operator_new(0x28);
  CVmSrcfEntry::CVmSrcfEntry
            (this_00,orig_index,(uint)(this->list_used_ == (ulong)(uint)orig_index),name_len);
  __ptr = this->list_;
  uVar2 = this->list_used_;
  uVar1 = this->list_alloc_;
  if (uVar1 <= uVar2) {
    this->list_alloc_ = uVar1 + 10;
    __size = uVar1 * 8 + 0x50;
    if (__ptr == (CVmSrcfEntry **)0x0) {
      __ptr = (CVmSrcfEntry **)malloc(__size);
    }
    else {
      __ptr = (CVmSrcfEntry **)realloc(__ptr,__size);
      uVar2 = this->list_used_;
    }
    this->list_ = __ptr;
  }
  __ptr[uVar2] = this_00;
  this->list_used_ = this->list_used_ + 1;
  return this_00;
}

Assistant:

CVmSrcfEntry *CVmSrcfTable::add_entry(int orig_index, size_t name_len)
{
    CVmSrcfEntry *entry;
    
    /* allocate the new entry */
    entry = new CVmSrcfEntry(orig_index, (uint)orig_index == list_used_,
                             name_len);

    /* 
     *   make sure we have room in our list for a new entry; if not,
     *   expand the list 
     */
    if (list_used_ >= list_alloc_)
    {
        size_t siz;
        
        /* calculate the expanded list size */
        list_alloc_ += 10;
        siz = list_alloc_ * sizeof(list_[0]);

        /* allocate or reallocate the list */
        if (list_ == 0)
            list_ = (CVmSrcfEntry **)t3malloc(siz);
        else
            list_ = (CVmSrcfEntry **)t3realloc(list_, siz);
    }

    /* add the new entry */
    list_[list_used_] = entry;

    /* count the new entry */
    ++list_used_;

    /* return the new entry */
    return entry;
}